

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Printer::PrintToString(Printer *this,Message *message,string *output)

{
  bool bVar1;
  FieldReporterLevel in_ECX;
  StringOutputStream output_stream;
  LogMessage LStack_28;
  
  if (output != (string *)0x0) {
    output->_M_string_length = 0;
    *(output->_M_dataplus)._M_p = '\0';
    io::StringOutputStream::StringOutputStream((StringOutputStream *)&LStack_28,output);
    bVar1 = Print(this,message,(ZeroCopyOutputStream *)&LStack_28,in_ECX);
    return bVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
             ,0x8af,"output");
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&LStack_28,(char (*) [28])"output specified is nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_28)
  ;
}

Assistant:

bool TextFormat::Printer::PrintToString(const Message& message,
                                        std::string* output) const {
  ABSL_DCHECK(output) << "output specified is nullptr";

  output->clear();
  io::StringOutputStream output_stream(output);

  return Print(message, &output_stream,
               internal::FieldReporterLevel::kMemberPrintToString);
}